

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::InsertSyntheticTestCase(string *name,CodeLocation *location)

{
  int iVar1;
  char *pcVar2;
  TestFactoryBase *factory;
  allocator local_139;
  anon_class_72_2_4f66548f_for_factory_ local_138;
  string full_name;
  string message;
  string local_b0 [32];
  CodeLocation local_90;
  anon_class_72_2_4f66548f_for_factory_ local_68;
  
  std::operator+(&local_138.message,"Paramaterized test suite ",name);
  std::operator+(&message,&local_138.message,
                 " is defined via TEST_P, but never instantiated. None of the test cases will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only ones provided expand to nothing.\n\nIdeally, TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)"
                );
  std::__cxx11::string::~string((string *)&local_138);
  std::operator+(&local_138.message,"UninstantiatedParamaterizedTestSuite<",name);
  std::operator+(&full_name,&local_138.message,">");
  std::__cxx11::string::~string((string *)&local_138);
  pcVar2 = (location->file)._M_dataplus._M_p;
  iVar1 = location->line;
  std::__cxx11::string::string((string *)&local_68,(string *)&message);
  CodeLocation::CodeLocation(&local_68.location,location);
  std::__cxx11::string::string(local_b0,pcVar2,&local_139);
  std::__cxx11::string::string((string *)&local_90,local_b0);
  local_90.line = iVar1;
  factory = (TestFactoryBase *)operator_new(0x50);
  InsertSyntheticTestCase(std::__cxx11::string_const&,testing::internal::CodeLocation)::$_0::__0
            ((__0 *)&local_138,&local_68);
  factory->_vptr_TestFactoryBase =
       (_func_int **)
       (
       _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal23InsertSyntheticTestCaseERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEENS2_12CodeLocationEE3__0EEPNS_8TestInfoEPKcSG_SG_SG_SG_iT0_E11FactoryImpl
       + 0x10);
  InsertSyntheticTestCase(std::__cxx11::string_const&,testing::internal::CodeLocation)::$_0::__0
            ((__0 *)(factory + 1),&local_138);
  MakeAndRegisterTestInfo
            ("GoogleTestVerification",full_name._M_dataplus._M_p,(char *)0x0,(char *)0x0,&local_90,
             &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
             (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
  InsertSyntheticTestCase(std::__cxx11::string_const&,testing::internal::CodeLocation)::$_0::~__0
            ((__0 *)&local_138);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_b0);
  InsertSyntheticTestCase(std::__cxx11::string_const&,testing::internal::CodeLocation)::$_0::~__0
            ((__0 *)&local_68);
  std::__cxx11::string::~string((string *)&full_name);
  std::__cxx11::string::~string((string *)&message);
  return;
}

Assistant:

void InsertSyntheticTestCase(const std::string &name, CodeLocation location) {
  std::string message =
      "Paramaterized test suite " + name +
      " is defined via TEST_P, but never instantiated. None of the test cases "
      "will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only "
      "ones provided expand to nothing."
      "\n\n"
      "Ideally, TEST_P definitions should only ever be included as part of "
      "binaries that intend to use them. (As opposed to, for example, being "
      "placed in a library that may be linked in to get other utilities.)";

  std::string full_name = "UninstantiatedParamaterizedTestSuite<" + name + ">";
  RegisterTest(  //
      "GoogleTestVerification", full_name.c_str(),
      nullptr,  // No type parameter.
      nullptr,  // No value parameter.
      location.file.c_str(), location.line, [message, location] {
        return new FailureTest(location, message,
                               kErrorOnUninstantiatedParameterizedTest);
      });
}